

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O1

int main(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong local_38;
  quota q;
  
  plan(3);
  _space(_stdout);
  lVar5 = 0;
  printf("# *** %s ***\n","main");
  test_basic();
  test_hard_lease();
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_leases_on_destroy");
  local_38 = 0xffffffff00000000;
  uVar2 = 0x100000;
  do {
    do {
      uVar4 = (uint)local_38 + (int)(uVar2 + 0x3ff >> 10);
      if (uVar4 <= (uint)local_38) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      iVar1 = 1;
      if (uVar4 <= (uint)(local_38 >> 0x20)) {
        local_38 = (ulong)uVar4 | local_38 & 0xffffffff00000000;
        LOCK();
        UNLOCK();
        iVar1 = 3;
      }
    } while (iVar1 == 0);
    if (iVar1 == 3) {
      uVar3 = (ulong)((uint)(uVar2 + 0x3ff) & 0x3ffc00);
    }
    else {
      uVar3 = 0xffffffffffffffff;
    }
    if (-1 < (long)uVar3) {
      lVar5 = lVar5 + 100;
    }
  } while ((199 < uVar2) && (uVar2 = uVar2 >> 1, (long)uVar3 < 0));
  _ok((uint)(-1 < (long)uVar3),"quota_lease(&l, 100) == 100",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6c
      ,"line %d",0x6c);
  if (0 < (long)uVar3) {
    if ((uVar3 & 0x3ff) != 0) {
      __assert_fail("lessor->used % QUOTA_UNIT_SIZE == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota_lessor.h"
                    ,0x69,"void quota_lessor_destroy(struct quota_lessor *)");
    }
    lVar5 = 0;
    uVar4 = (uint)(uVar3 >> 10);
    if ((uint)local_38 < uVar4) {
      __assert_fail("size_in_units <= used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xab,"ssize_t quota_release(struct quota *, size_t)");
    }
    local_38 = (ulong)((uint)local_38 - uVar4);
    LOCK();
    UNLOCK();
  }
  _ok((uint)(lVar5 == 0),"quota_leased(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6e
      ,"line %d",0x6e);
  _ok((uint)(lVar5 == 0),"quota_available(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6f
      ,"line %d",0x6f);
  _ok((uint)((int)local_38 == 0),"quota_used(&q) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x70
      ,"line %d",0x70);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_leases_on_destroy");
  check_plan();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(3);
	header();

	test_basic();
	test_hard_lease();
	test_leases_on_destroy();

	footer();
	return check_plan();
}